

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.cpp
# Opt level: O2

vm_obj_id_t CVmObjStrComp::create_from_stack(uchar **pc_ptr,uint argc)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  vm_obj_id_t obj_id;
  ushort *puVar4;
  size_t sVar5;
  CVmObjStrComp *this;
  ulong uVar6;
  size_t total_chars;
  vm_val_t *this_00;
  size_t equiv_cnt;
  size_t local_60;
  CVmObjStrCompMapReaderList reader;
  vm_val_t val;
  
  if (argc != 3) {
    err_throw(0x899);
  }
  if (sp_[-1].typ == VM_NIL) {
    sp_ = sp_ + -1;
    local_60 = 0;
  }
  else {
    iVar1 = CVmBif::pop_int_val();
    local_60 = (size_t)iVar1;
  }
  iVar1 = CVmBif::pop_bool_val();
  equiv_cnt = 0;
  total_chars = 0;
  this_00 = (vm_val_t *)0x0;
  if (sp_[-1].typ != VM_NIL) {
    this_00 = sp_ + -1;
    iVar2 = vm_val_t::is_listlike(this_00);
    if ((iVar2 == 0) || (uVar3 = vm_val_t::ll_length(this_00), (int)uVar3 < 0)) {
LAB_00271b69:
      err_throw(0x900);
    }
    equiv_cnt = (size_t)uVar3;
    total_chars = 0;
    for (uVar6 = 0; equiv_cnt != uVar6; uVar6 = uVar6 + 1) {
      vm_val_t::ll_index(this_00,(vm_val_t *)&reader,(int)uVar6 + 1);
      iVar2 = vm_val_t::is_listlike((vm_val_t *)&reader);
      if (iVar2 == 0) goto LAB_00271b69;
      vm_val_t::ll_index((vm_val_t *)&reader,&val,2);
      puVar4 = (ushort *)vm_val_t::get_as_string(&val);
      if (puVar4 == (ushort *)0x0) goto LAB_00271b69;
      sVar5 = utf8_ptr::s_len((char *)(puVar4 + 1),(ulong)*puVar4);
      total_chars = total_chars + sVar5;
    }
  }
  obj_id = vm_new_id(0,0,0);
  this = (CVmObjStrComp *)CVmObject::operator_new(0x10,obj_id);
  (this->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_0031fc70;
  (this->super_CVmObject).ext_ = (char *)0x0;
  reader.super_CVmObjStrCompMapReader._vptr_CVmObjStrCompMapReader =
       (_func_int **)&PTR_read_mapping_0031ff18;
  reader.idx_ = 1;
  reader.lst_ = this_00;
  alloc_ext(this,local_60,iVar1,equiv_cnt,total_chars,&reader.super_CVmObjStrCompMapReader);
  sp_ = sp_ + -1;
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjStrComp::create_from_stack(
    VMG_ const uchar **pc_ptr, uint argc)
{
    size_t trunc_len;
    int case_sensitive;
    const vm_val_t *lst;
    vm_obj_id_t id;
    CVmObjStrComp *obj;
    size_t equiv_cnt;
    size_t total_chars;
    
    /* check arguments */
    if (argc != 3)
        err_throw(VMERR_WRONG_NUM_OF_ARGS);

    /* pop the truncation length parameter */
    if (G_stk->get(0)->typ == VM_NIL)
    {
        /* it's nil, so truncation is not allowed */
        trunc_len = 0;
        G_stk->discard();
    }
    else
    {
        /* retrieve the truncation length as an integer */
        trunc_len = CVmBif::pop_int_val(vmg0_);
    }

    /* get the case sensitivity flag */
    case_sensitive = CVmBif::pop_bool_val(vmg0_);

    /* 
     *   retrieve the mapping list, but leave it on the stack (for gc
     *   protection) 
     */
    if (G_stk->get(0)->typ == VM_NIL)
    {
        /* there are no mappings */
        lst = 0;
        equiv_cnt = 0;
        total_chars = 0;
    }
    else
    {
        size_t i;
        int ec;
        
        /* get the list value from the argument */
        lst = G_stk->get(0);
        if (!lst->is_listlike(vmg0_)
            || (ec = lst->ll_length(vmg0_)) < 0)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* run through the list and count the value string characters */
        for (i = 1, total_chars = 0, equiv_cnt = ec ; i <= equiv_cnt ; ++i)
        {
            vm_val_t sublst;
            vm_val_t val;
            const char *strp;
            utf8_ptr ustrp;

            /* get this mapping from the list */
            lst->ll_index(vmg_ &sublst, i);

            /* make sure it's a sublist */
            if (!sublst.is_listlike(vmg0_))
                err_throw(VMERR_BAD_TYPE_BIF);

            /* 
             *   get the second element of the mapping sublist - this is the
             *   value string 
             */
            sublst.ll_index(vmg_ &val, 2);
            if ((strp = val.get_as_string(vmg0_)) == 0)
                err_throw(VMERR_BAD_TYPE_BIF);

            /* add the character length of the string to the total */
            ustrp.set((char *)strp + VMB_LEN);
            total_chars += ustrp.len(vmb_get_len(strp));
        }
    }

    /* create the new object */
    id = vm_new_id(vmg_ FALSE, FALSE, FALSE);
    obj = new (vmg_ id) CVmObjStrComp();

    /* set up a list-based mapping reader */
    CVmObjStrCompMapReaderList reader(lst);

    /* allocate and initialize the new object's extension */
    obj->alloc_ext(vmg_ trunc_len, case_sensitive, equiv_cnt, total_chars,
                   &reader);

    /* discard the gc protection */
    G_stk->discard();

    /* return the new object */
    return id;
}